

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_KillChildren(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *source;
  AActor *inflictor;
  AActor *killtarget;
  AActor *pAVar3;
  int selector;
  char *pcVar4;
  AActor *origin;
  int selector_00;
  TThinkerIterator<AActor> it;
  int local_64;
  int local_60;
  int local_5c;
  PClassActor *local_58;
  FName local_50;
  FName local_4c;
  FThinkerIterator local_48;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_005c92ef;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005c92df;
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_005c8faf;
    bVar2 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005c92ef;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_005c92df;
LAB_005c8faf:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
LAB_005c9040:
    local_5c = 0;
LAB_005c9053:
    local_58 = (PClassActor *)0x0;
    local_60 = 0;
LAB_005c905b:
    local_64 = 0;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005c92df:
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005c92ef;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c92ef;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_005c92df;
    }
    if ((uint)numparam < 3) goto LAB_005c9040;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar4 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005c92ef:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    if (numparam == 3) goto LAB_005c9040;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_5c = param[3].field_0.i;
    }
    else {
      local_5c = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1968,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((uint)numparam < 5) goto LAB_005c9053;
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_60 = param[4].field_0.i;
    }
    else {
      local_60 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1969,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam == 5) {
      local_58 = (PClassActor *)0x0;
      goto LAB_005c905b;
    }
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == 0xff) goto LAB_005c91ff;
    if (VVar1 != '\x03') {
LAB_005c9310:
      pcVar4 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
LAB_005c9317:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196a,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    local_58 = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag == 1) {
      if (local_58 == (PClassActor *)0x0) goto LAB_005c91ff;
      bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)local_58);
      if (!bVar2) {
        pcVar4 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c9317;
      }
    }
    else {
      if (local_58 != (PClassActor *)0x0) goto LAB_005c9310;
LAB_005c91ff:
      local_58 = (PClassActor *)0x0;
    }
    if ((uint)numparam < 7) goto LAB_005c905b;
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_64 = param[6].field_0.i;
    }
    else {
      local_64 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x196b,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (numparam != 7) {
      VVar1 = param[7].field_0.field_3.Type;
      if (VVar1 == '\0') {
        selector = param[7].field_0.i;
      }
      else {
        selector = 0;
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x196c,
                        "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      selector_00 = 0;
      if (8 < (uint)numparam) {
        VVar1 = param[8].field_0.field_3.Type;
        if (VVar1 == '\0') {
          selector_00 = param[8].field_0.i;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x196d,
                        "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      goto LAB_005c9066;
    }
  }
  selector = 0;
  selector_00 = 0;
LAB_005c9066:
  source = COPY_AAPTR(origin,selector);
  inflictor = COPY_AAPTR(origin,selector_00);
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_48,0x80);
  while (killtarget = (AActor *)FThinkerIterator::Next(&local_48), killtarget != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&killtarget->master);
    if (pAVar3 == origin) {
      local_4c.Index = local_5c;
      local_50.Index = local_64;
      DoKill(killtarget,inflictor,source,&local_4c,local_60,local_58,&local_50);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillChildren)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self) 
		{
			DoKill(mo, inflictor, source, damagetype, flags, filter, species);
		}
	}
	return 0;
}